

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::RemoveLast(ExtensionSet *this,int number)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  _Base_ptr p_Var4;
  LogMessage *pLVar5;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  LogFinisher local_51;
  LogMessage local_50;
  
  p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var6->_M_header;
  if (p_Var4 == (_Base_ptr)0x0) {
LAB_00164ef5:
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x248);
    pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: iter != extensions_.end(): ");
    pLVar5 = LogMessage::operator<<(pLVar5,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar5);
    LogMessage::~LogMessage(&local_50);
    p_Var7 = &p_Var6->_M_header;
  }
  else {
    do {
      if (number <= (int)p_Var4[1]._M_color) {
        p_Var7 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < number];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var6) || (number < (int)p_Var7[1]._M_color))
    goto LAB_00164ef5;
  }
  if (*(char *)((long)&p_Var7[1]._M_left + 1) == '\0') {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x24b);
    pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_51,pLVar5);
    LogMessage::~LogMessage(&local_50);
  }
  bVar1 = *(byte *)&p_Var7[1]._M_left;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x35);
    pLVar5 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_51,pLVar5);
    LogMessage::~LogMessage(&local_50);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4)) {
  case 1:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
LAB_001652e9:
      LogMessage::~LogMessage(&local_50);
      iVar3 = *(int *)&p_Var4->_M_parent;
    }
    break;
  case 2:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 3:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 4:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 5:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 6:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 7:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 8:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x283);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      goto LAB_001652e9;
    }
    break;
  case 9:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x352);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      LogMessage::~LogMessage(&local_50);
      iVar3 = *(int *)&p_Var4->_M_parent;
    }
    *(int *)&p_Var4->_M_parent = iVar3 + -1;
    puVar2 = *(undefined8 **)(*(long *)p_Var4 + -8 + (long)iVar3 * 8);
    puVar2[1] = 0;
    *(undefined1 *)*puVar2 = 0;
    return;
  case 10:
    p_Var4 = p_Var7[1]._M_parent;
    iVar3 = *(int *)&p_Var4->_M_parent;
    if (iVar3 < 1) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x352);
      pLVar5 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
      LogFinisher::operator=(&local_51,pLVar5);
      LogMessage::~LogMessage(&local_50);
      iVar3 = *(int *)&p_Var4->_M_parent;
    }
    *(int *)&p_Var4->_M_parent = iVar3 + -1;
    (**(code **)(**(long **)(*(long *)p_Var4 + -8 + (long)iVar3 * 8) + 0x20))();
  default:
    goto switchD_0016500b_default;
  }
  *(int *)&p_Var4->_M_parent = iVar3 + -1;
switchD_0016500b_default:
  return;
}

Assistant:

void ExtensionSet::RemoveLast(int number) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";

  Extension* extension = &iter->second;
  GOOGLE_DCHECK(extension->is_repeated);

  switch(cpp_type(extension->type)) {
    case WireFormatLite::CPPTYPE_INT32:
      extension->repeated_int32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_INT64:
      extension->repeated_int64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT32:
      extension->repeated_uint32_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_UINT64:
      extension->repeated_uint64_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_FLOAT:
      extension->repeated_float_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_DOUBLE:
      extension->repeated_double_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_BOOL:
      extension->repeated_bool_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_ENUM:
      extension->repeated_enum_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_STRING:
      extension->repeated_string_value->RemoveLast();
      break;
    case WireFormatLite::CPPTYPE_MESSAGE:
      extension->repeated_message_value->RemoveLast();
      break;
  }
}